

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

Greetable * object_peek_greetable(Object *object)

{
  undefined8 uVar1;
  long lVar2;
  GType GVar3;
  GDBusInterface *ret;
  Object *object_local;
  
  uVar1 = g_dbus_object_get_type();
  uVar1 = g_type_check_instance_cast(object,uVar1);
  lVar2 = g_dbus_object_get_interface(uVar1,"io.mangoh.Testing.Greetable");
  if (lVar2 == 0) {
    object_local = (Object *)0x0;
  }
  else {
    g_object_unref(lVar2);
    GVar3 = greetable_get_type();
    object_local = (Object *)g_type_check_instance_cast(lVar2,GVar3);
  }
  return (Greetable *)object_local;
}

Assistant:

Greetable *object_peek_greetable (Object *object)
{
  GDBusInterface *ret;
  ret = g_dbus_object_get_interface (G_DBUS_OBJECT (object), "io.mangoh.Testing.Greetable");
  if (ret == NULL)
    return NULL;
  g_object_unref (ret);
  return GREETABLE (ret);
}